

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompress.hpp
# Opt level: O3

void __thiscall
gzip::Decompressor::decompress<std::__cxx11::string>
          (Decompressor *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output,char *data,
          size_t size)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  runtime_error *prVar4;
  long lVar5;
  string error_msg;
  allocator<char> local_b9;
  string local_b8 [32];
  char *local_98;
  undefined4 local_90;
  pointer local_80;
  uint local_78;
  char *local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  local_90 = 0;
  local_98 = (char *)0x0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  iVar2 = inflateInit2_(&local_98,0x2f,"1.2.11",0x70);
  if (iVar2 == 0) {
    local_98 = data;
    if ((this->max_ < size) || (uVar1 = size * 2, this->max_ < uVar1)) {
      inflateEnd(&local_98);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,"size may use more memory than intended when decompressing");
    }
    else {
      local_90 = (undefined4)size;
      lVar5 = 0;
      while (lVar5 + uVar1 <= this->max_) {
        std::__cxx11::string::resize((ulong)output,(char)(lVar5 + uVar1));
        local_78 = (uint)uVar1;
        local_80 = (output->_M_dataplus)._M_p + lVar5;
        uVar3 = inflate(&local_98,4);
        if ((1 < uVar3) && (uVar3 != 0xfffffffb)) {
          std::__cxx11::string::string<std::allocator<char>>(local_b8,local_68,&local_b9);
          inflateEnd(&local_98);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,local_b8);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar5 = lVar5 + (uVar1 - local_78);
        if ((ulong)local_78 != 0) {
          inflateEnd(&local_98);
          std::__cxx11::string::resize((ulong)output,(char)lVar5);
          return;
        }
      }
      inflateEnd(&local_98);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,
                 "size of output string will use more memory then intended when decompressing");
    }
  }
  else {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"inflate init failed");
  }
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void decompress(OutputType &output,
                        const char *data,
                        std::size_t size) const {
            z_stream inflate_s;

            inflate_s.zalloc = Z_NULL;
            inflate_s.zfree = Z_NULL;
            inflate_s.opaque = Z_NULL;
            inflate_s.avail_in = 0;
            inflate_s.next_in = Z_NULL;

            // The windowBits parameter is the base two logarithm of the window size (the size of the history buffer).
            // It should be in the range 8..15 for this version of the library.
            // Larger values of this parameter result in better compression at the expense of memory usage.
            // This range of values also changes the decoding type:
            //  -8 to -15 for raw deflate
            //  8 to 15 for zlib
            // (8 to 15) + 16 for gzip
            // (8 to 15) + 32 to automatically detect gzip/zlib header
            constexpr int window_bits = 15 + 32; // auto with windowbits of 15

#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wold-style-cast"
            if (inflateInit2(&inflate_s, window_bits) != Z_OK) {
                throw std::runtime_error("inflate init failed");
            }
#pragma GCC diagnostic pop
            inflate_s.next_in = reinterpret_cast<z_const Bytef *>(data);

#ifdef DEBUG
            // Verify if size (long type) input will fit into unsigned int, type used for zlib's avail_in
            std::uint64_t size_64 = size * 2;
            if (size_64 > std::numeric_limits<unsigned int>::max())
            {
                inflateEnd(&inflate_s);
                throw std::runtime_error("size arg is too large to fit into unsigned int type x2");
            }
#endif
            if (size > max_ || (size * 2) > max_) {
                inflateEnd(&inflate_s);
                throw std::runtime_error("size may use more memory than intended when decompressing");
            }
            inflate_s.avail_in = static_cast<unsigned int>(size);
            std::size_t size_uncompressed = 0;
            do {
                std::size_t resize_to = size_uncompressed + 2 * size;
                if (resize_to > max_) {
                    inflateEnd(&inflate_s);
                    throw std::runtime_error(
                            "size of output string will use more memory then intended when decompressing");
                }
                output.resize(resize_to);
                inflate_s.avail_out = static_cast<unsigned int>(2 * size);
                inflate_s.next_out = reinterpret_cast<Bytef *>(&output[0] + size_uncompressed);
                int ret = inflate(&inflate_s, Z_FINISH);
                if (ret != Z_STREAM_END && ret != Z_OK && ret != Z_BUF_ERROR) {
                    std::string error_msg = inflate_s.msg;
                    inflateEnd(&inflate_s);
                    throw std::runtime_error(error_msg);
                }

                size_uncompressed += (2 * size - inflate_s.avail_out);
            } while (inflate_s.avail_out == 0);
            inflateEnd(&inflate_s);
            output.resize(size_uncompressed);
        }